

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdMicroAllocator.cpp
# Opt level: O2

void __thiscall
HACD::MyMicroAllocator::addMicroChunk
          (MyMicroAllocator *this,NxU8 *memStart,NxU8 *memEnd,MemoryChunk *chunk)

{
  MicroChunk *pMVar1;
  undefined8 *puVar2;
  MicroChunk *pMVar3;
  NxU8 *pNVar4;
  MemoryChunk *pMVar5;
  NxU8 *pNVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  
  uVar9 = this->mMicroChunkCount;
  if (this->mMaxMicroChunks <= uVar9) {
    allocateMicroChunks(this);
    uVar9 = this->mMicroChunkCount;
  }
  pMVar3 = this->mMicroChunks;
  uVar7 = (ulong)uVar9;
  lVar8 = 0x18;
  uVar11 = 0;
  do {
    if (uVar7 == uVar11) {
      pMVar3[uVar7].mMemStart = memStart;
      pMVar3[uVar7].mMemEnd = memEnd;
      pMVar3[uVar7].mChunk = chunk;
      pMVar3[uVar7].mPad = (NxU8 *)0x0;
      this->mLastMicroChunk = pMVar3 + uVar7;
LAB_00d85326:
      this->mMicroChunkCount = uVar9 + 1;
      return;
    }
    if (memEnd < *(NxU8 **)((long)pMVar3 + lVar8 + -0x18)) {
      lVar10 = uVar7 << 5;
      while (pMVar3 = this->mMicroChunks, uVar11 < uVar7) {
        uVar7 = uVar7 - 1;
        pMVar1 = pMVar3 + (uVar7 & 0xffffffff);
        pNVar4 = pMVar1->mMemEnd;
        pMVar5 = pMVar1->mChunk;
        pNVar6 = pMVar1->mPad;
        puVar2 = (undefined8 *)((long)&pMVar3->mMemStart + lVar10);
        *puVar2 = pMVar1->mMemStart;
        puVar2[1] = pNVar4;
        puVar2[2] = pMVar5;
        puVar2[3] = pNVar6;
        lVar10 = lVar10 + -0x20;
      }
      pMVar3 = (MicroChunk *)((long)pMVar3 + lVar8 + -0x18);
      pMVar3->mMemStart = memStart;
      pMVar3->mMemEnd = memEnd;
      pMVar3->mChunk = chunk;
      pMVar3->mPad = (NxU8 *)0x0;
      this->mLastMicroChunk = pMVar3;
      uVar9 = this->mMicroChunkCount;
      goto LAB_00d85326;
    }
    uVar11 = uVar11 + 1;
    lVar8 = lVar8 + 0x20;
  } while( true );
}

Assistant:

virtual void addMicroChunk(NxU8 *memStart,NxU8 *memEnd,MemoryChunk *chunk)
  {
    if ( mMicroChunkCount >= mMaxMicroChunks )
    {
        allocateMicroChunks();
    }

    bool inserted = false;
    for (NxU32 i=0; i<mMicroChunkCount; i++)
    {
        if ( memEnd < mMicroChunks[i].mMemStart )
        {
            for (NxU32 j=mMicroChunkCount; j>i; j--)
            {
                mMicroChunks[j] = mMicroChunks[j-1];
            }
            mMicroChunks[i].set( memStart, memEnd, chunk );
			mLastMicroChunk = &mMicroChunks[i];
            mMicroChunkCount++;
            inserted = true;
            break;
        }
    }
    if ( !inserted )
    {
        mMicroChunks[mMicroChunkCount].set(memStart,memEnd,chunk);
		mLastMicroChunk = &mMicroChunks[mMicroChunkCount];
        mMicroChunkCount++;
    }
  }